

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O3

int slu_mmdnum_(int *neqns,int *perm,int *invp,shortint *qsize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  int iVar8;
  
  uVar1 = *neqns;
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      iVar3 = -invp[uVar7];
      if (qsize[uVar7] < 1) {
        iVar3 = invp[uVar7];
      }
      perm[uVar7] = iVar3;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    uVar1 = *neqns;
    if (0 < (int)uVar1) {
      uVar7 = 1;
      do {
        if (perm[uVar7 - 1] < 1) {
          piVar6 = perm + (uVar7 - 1);
          uVar4 = uVar7 & 0xffffffff;
          do {
            iVar3 = (int)uVar4;
            uVar2 = perm[(long)iVar3 + -1];
            uVar4 = (ulong)-uVar2;
          } while ((int)uVar2 < 1);
          invp[uVar7 - 1] = ~uVar2;
          perm[(long)iVar3 + -1] = uVar2 + 1;
          iVar8 = perm[uVar7 - 1];
          if (iVar8 < 0) {
            do {
              *piVar6 = -iVar3;
              piVar6 = perm + ((ulong)(uint)-iVar8 - 1);
              iVar8 = *piVar6;
            } while (iVar8 < 0);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (ulong)uVar1 + 1);
      uVar1 = *neqns;
      if (0 < (int)uVar1) {
        lVar5 = 1;
        do {
          iVar3 = invp[lVar5 + -1];
          invp[lVar5 + -1] = -iVar3;
          perm[-1 - (long)iVar3] = (int)lVar5;
          lVar5 = lVar5 + 1;
        } while ((ulong)uVar1 + 1 != lVar5);
      }
    }
  }
  return 0;
}

Assistant:

int slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize)
{
    /* System generated locals */

    int i__1;

    /* Local variables */
    int_t node, root, nextf, father, nqsize, num;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --qsize;
    --invp;
    --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	nqsize = qsize[node];
	if (nqsize <= 0) {
	    perm[node] = invp[node];
	}
	if (nqsize > 0) {
	    perm[node] = -invp[node];
	}
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	if (perm[node] > 0) {
	    goto L500;
	}
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
	father = node;
L200:
	if (perm[father] > 0) {
	    goto L300;
	}
	father = -perm[father];
	goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
	root = father;
	num = perm[root] + 1;
	invp[node] = -num;
	perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
	father = node;
L400:
	nextf = -perm[father];
	if (nextf <= 0) {
	    goto L500;
	}
	perm[father] = -root;
	father = nextf;
	goto L400;
L500:
	;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	num = -invp[node];
	invp[node] = num;
	perm[num] = node;
/* L600: */
    }
    return 0;

}